

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolk.c
# Opt level: O2

int ffintfr4(int *input,long ntodo,double scale,double zero,float *output,int *status)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  if (0 < ntodo) {
    lVar1 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      output[lVar2] = (float)(((double)input[lVar2] - zero) / scale);
    }
  }
  else {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      output[lVar2] = (float)input[lVar2];
    }
  }
  return *status;
}

Assistant:

int ffintfr4(int *input,       /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            float *output,     /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
                output[ii] = (float) input[ii];
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = (float) ((input[ii] - zero) / scale);
    }
    return(*status);
}